

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

void __thiscall wasm::TableCopy::finalize(TableCopy *this)

{
  (this->super_SpecificExpression<(wasm::Expression::Id)50>).super_Expression.type.id = 0;
  if ((((this->dest->type).id == 1) || ((this->source->type).id == 1)) ||
     ((this->size->type).id == 1)) {
    (this->super_SpecificExpression<(wasm::Expression::Id)50>).super_Expression.type.id = 1;
  }
  return;
}

Assistant:

void TableCopy::finalize() {
  type = Type::none;
  if (dest->type == Type::unreachable || source->type == Type::unreachable ||
      size->type == Type::unreachable) {
    type = Type::unreachable;
  }
}